

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerWriteBarrierManager.cpp
# Opt level: O1

bool __thiscall
Memory::X64WriteBarrierCardTableManager::OnSegmentAlloc
          (X64WriteBarrierCardTableManager *this,char *segmentAddress,size_t numPages)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  BOOLEAN BVar4;
  DWORD DVar5;
  ulong uVar6;
  LPVOID pvVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  BYTE *lpAddress;
  undefined8 *in_FS_OFFSET;
  AutoNestedHandledExceptionType local_4c;
  BYTE *pBStack_48;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  bool local_34;
  
  if (this->_cardTable == (BYTE *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerWriteBarrierManager.cpp"
                       ,0x5e,"(_cardTable)","_cardTable");
    if (!bVar3) goto LAB_0028ca57;
    *puVar1 = 0;
  }
  this->_lastCommitState = CommitStateOnSegmentAlloc;
  if (segmentAddress < AutoSystemInfo::Data.super_SYSTEM_INFO.lpMaximumApplicationAddress) {
    CCLock::Enter(&(this->_cardTableInitCriticalSection).super_CCLock);
    uVar8 = (ulong)segmentAddress >> 0x18;
    this->_lastSegmentAddress = segmentAddress;
    this->_lastSegmentNumPages = numPages;
    uVar9 = (uint)((ulong)segmentAddress >> 0x18);
    this->_lastSectionIndexStart = uVar8 & 0xffffffff;
    uVar10 = (uint)((ulong)(segmentAddress + numPages * 0x1000 + -1) >> 0x18);
    this->_lastSectionIndexLast =
         (ulong)(segmentAddress + numPages * 0x1000 + -1) >> 0x18 & 0xffffffff;
    local_34 = true;
    if (uVar9 <= uVar10) {
      uVar6 = uVar8 & 0xffffffff;
      pBStack_48 = (BYTE *)segmentAddress;
      do {
        BVar4 = BVSparse<Memory::HeapAllocator>::Test(&committedSections,(BVIndex)uVar6);
        if (BVar4 == '\0') {
          this->_lastCommitState = CommitStateOnNeedCommit;
          uVar6 = (ulong)pBStack_48 >> 0xc;
          if ((ulong)(segmentAddress + numPages * 0x1000) >> 0xc < uVar6) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar1 = (undefined4 *)*in_FS_OFFSET;
            *puVar1 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerWriteBarrierManager.cpp"
                               ,0x94,"(startIndex <= endIndex)","startIndex <= endIndex");
            if (!bVar3) goto LAB_0028ca57;
            *puVar1 = 0;
          }
          lpAddress = (BYTE *)((ulong)(this->_cardTable + uVar6) & 0xfffffffffffff000);
          pBStack_48 = (BYTE *)((ulong)(this->_cardTable +
                                       ((ulong)(segmentAddress + numPages * 0x1000) >> 0xc) + 0xfff)
                               & 0xfffffffffffff000);
          this->_lastSectionStart = lpAddress;
          this->_lastSectionEnd = pBStack_48;
          pBStack_48 = pBStack_48 + -(long)lpAddress;
          if (pBStack_48 == (BYTE *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar1 = (undefined4 *)*in_FS_OFFSET;
            *puVar1 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerWriteBarrierManager.cpp"
                               ,0xa1,"(commitSize > 0)","commitSize > 0");
            if (!bVar3) goto LAB_0028ca57;
            *puVar1 = 0;
          }
          if ((ulong)pBStack_48 >> 0xc != (ulong)((uVar10 - uVar9) + 1)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar1 = (undefined4 *)*in_FS_OFFSET;
            *puVar1 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerWriteBarrierManager.cpp"
                               ,0xa3,
                               "(commitSize / pageSize == sectionLastIndex - sectionStartIndex + 1)"
                               ,"commitSize / pageSize == sectionLastIndex - sectionStartIndex + 1")
            ;
            if (!bVar3) goto LAB_0028ca57;
            *puVar1 = 0;
          }
          pvVar7 = VirtualAlloc(lpAddress,(SIZE_T)pBStack_48,0x1000,4);
          if (pvVar7 != (LPVOID)0x0) {
            this->_lastCommitState = CommitStateOnSectionCommitted;
            AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                      (&local_4c,ExceptionType_DisableCheck);
            if (uVar9 <= uVar10) {
              uVar8 = uVar8 & 0xffffffff;
              do {
                BVSparse<Memory::HeapAllocator>::Set(&committedSections,(BVIndex)uVar8);
                uVar9 = (BVIndex)uVar8 + 1;
                uVar8 = (ulong)uVar9;
              } while (uVar9 <= uVar10);
            }
            this->_lastCommitState = CommitStateOnCommitBitSet;
            AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(&local_4c);
            break;
          }
          DVar5 = GetLastError();
          if (DVar5 == 0x1e7) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar1 = (undefined4 *)*in_FS_OFFSET;
            *puVar1 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerWriteBarrierManager.cpp"
                               ,0xac,"(::GetLastError() != 487L)",
                               "::GetLastError() != ERROR_INVALID_ADDRESS");
            if (!bVar3) goto LAB_0028ca57;
            *puVar1 = 0;
          }
          this->_lastCommitState = CommitStateFailedVirtualAlloc;
          local_34 = false;
          break;
        }
        uVar11 = (BVIndex)uVar6 + 1;
        uVar6 = (ulong)uVar11;
      } while (uVar11 <= uVar10);
    }
    CCLock::Leave(&(this->_cardTableInitCriticalSection).super_CCLock);
    return local_34;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar1 = (undefined4 *)*in_FS_OFFSET;
  *puVar1 = 1;
  bVar3 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerWriteBarrierManager.cpp"
                     ,100,"(false)","false");
  if (bVar3) {
    *puVar1 = 0;
    this->_lastCommitState = CommitStateFailedMaxAddressExceeded;
    Js::Throw::FatalInternalError(-0x7fffbffb);
  }
LAB_0028ca57:
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

bool
X64WriteBarrierCardTableManager::OnSegmentAlloc(_In_ char* segmentAddress, size_t numPages)
{
    Assert(_cardTable);

    SetCommitState(OnSegmentAlloc);

    if (segmentAddress >= AutoSystemInfo::Data.lpMaximumApplicationAddress)
    {
        Assert(false); // How did this happen?
        SetCommitState(FailedMaxAddressExceeded);
        Js::Throw::FatalInternalError();
    }

    AutoCriticalSection critSec(&_cardTableInitCriticalSection);

    size_t  pageSize = AutoSystemInfo::PageSize;

    // First, check if the pages for this segment have already been committed
    // If they have, there is nothing for us to do here.
    void*   segmentEndAddress = segmentAddress + (numPages * pageSize);
    void*   segmentLastWritableAddress = (char*)segmentEndAddress - 1;
    BVIndex sectionStartIndex = GetSectionIndex(segmentAddress);
    BVIndex sectionLastIndex = GetSectionIndex(segmentLastWritableAddress);

#ifdef X64_WB_DIAG
    this->_lastSegmentAddress = segmentAddress;
    this->_lastSegmentNumPages = numPages;
    this->_lastSectionIndexStart = sectionStartIndex;
    this->_lastSectionIndexLast = sectionLastIndex;
#endif

    bool needCommit = false;
    for (BVIndex i = sectionStartIndex; i <= sectionLastIndex; i++)
    {
        if (!committedSections.Test(i))
        {
            needCommit = true;
            break;
        }
    }

    if (!needCommit)
    {
        // The pages for this segment have already been committed.
        // We don't need to do anything more, since write barriers can
        // already be set for writes to this segment
        return true;
    }

    SetCommitState(OnNeedCommit);

    // There are uncommitted pages in this range. We'll commit the full range
    // We might commit some pages that are already committed but that's okay
    const uintptr_t startIndex = RecyclerWriteBarrierManager::GetCardTableIndex(segmentAddress);
    const uintptr_t endIndex   = RecyclerWriteBarrierManager::GetCardTableIndex(segmentEndAddress);

    Assert(startIndex <= endIndex);

    // Section Start is the card table's starting entry aligned *down* to the page boundary
    // Section End is the card table's ending entry aligned *up* to the page boundary
    BYTE* sectionStart = (BYTE*) (((uintptr_t) &_cardTable[startIndex]) & ~(pageSize - 1));
    BYTE* sectionEnd   = (BYTE*) Math::Align<uintptr_t>((uintptr_t)&_cardTable[endIndex], pageSize);
    size_t commitSize  = (sectionEnd - sectionStart);

#ifdef X64_WB_DIAG
    _lastSectionStart = sectionStart;
    _lastSectionEnd = sectionEnd;
#endif

    Assert(commitSize > 0);
    Assert(commitSize % pageSize == 0);
    Assert(commitSize / pageSize == sectionLastIndex - sectionStartIndex + 1);

    LPVOID ret = ::VirtualAlloc((LPVOID) sectionStart, commitSize, MEM_COMMIT, PAGE_READWRITE);
    if (!ret)
    {
        // If this is the error that occurred while trying to commit the page, this likely means
        // that the page we tried to commit is outside out reservation, which means that our reservation
        // was too small. This can happen if Windows increases the maximum process address space size
        // If this happens, X64WriteBarrierCardTableManager::Initialize will have to be updated
        Assert(::GetLastError() != ERROR_INVALID_ADDRESS);
        SetCommitState(FailedVirtualAlloc);
        return false;
    }

    SetCommitState(OnSectionCommitted);
    BVIndex sectionIndex = sectionStartIndex;

    try
    {
#ifdef EXCEPTION_CHECK
        AUTO_NESTED_HANDLED_EXCEPTION_TYPE(ExceptionType_DisableCheck);
#endif

        for (; sectionIndex <= sectionLastIndex; sectionIndex++)
        {
            committedSections.Set(sectionIndex);
        }

        SetCommitState(OnCommitBitSet);
    }
    catch (Js::OutOfMemoryException)
    {
        SetCommitState(FailedCommitBitSet);

        // We ran out of memory allocating a node for the sparse bit vector, so clean up
        // and return false
        // Since setting sectionIndex threw the exception, we don't clear it, we clear until the index before it
        for (BVIndex i = sectionStartIndex; i < sectionIndex; i++)
        {
            BOOLEAN wasSet = committedSections.TestAndClear(i);
            Assert(wasSet == TRUE);
        }

#pragma prefast(suppress:6250, "This method decommits memory")
        BOOL result = ::VirtualFree((LPVOID)sectionStart, commitSize, MEM_DECOMMIT);
        Assert(result != 0);
        return false;
    }

    return true;
}